

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<pickrst_test_highbd::PixelProjHighbdErrorTest_RandomValues_Test>::
CreateTest(ParameterizedTestFactory<pickrst_test_highbd::PixelProjHighbdErrorTest_RandomValues_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<long(*const)(unsigned_char_const*,int,int,int,unsigned_char_const*,int,int*,int,int*,int,int*,sgr_params_type_const*)>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x48);
  pickrst_test_highbd::PixelProjHighbdErrorTest_RandomValues_Test::
  PixelProjHighbdErrorTest_RandomValues_Test((PixelProjHighbdErrorTest_RandomValues_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }